

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O3

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 void *ptr,size_t size,int tag_mode)

{
  ber_tlv_len_t *last_length;
  void **ppvVar1;
  asn_struct_ctx_t *opt_ctx;
  short sVar2;
  asn_TYPE_member_s *paVar3;
  int *piVar4;
  asn_dec_rval_t aVar5;
  asn_dec_rval_t aVar6;
  asn_dec_rval_t aVar7;
  asn_dec_rval_t aVar8;
  asn_dec_rval_t aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ssize_t sVar13;
  long lVar14;
  asn_dec_rval_t aVar19;
  long extraout_RDX;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  ber_tlv_tag_t tlv_tag;
  void *local_38;
  
  paVar3 = td->elements;
  piVar4 = (int *)td->specifics;
  local_38 = *struct_ptr;
  if (local_38 == (void *)0x0) {
    local_38 = calloc(1,(long)*piVar4);
    *struct_ptr = local_38;
    if (local_38 == (void *)0x0) {
      uVar16 = 2;
      goto LAB_001456c1;
    }
  }
  lVar14 = (long)piVar4[1];
  opt_ctx = (asn_struct_ctx_t *)((long)local_38 + lVar14);
  sVar2 = *(short *)((long)local_38 + lVar14);
  uVar16 = 0;
  if (sVar2 == 0) {
    last_length = &opt_ctx->left;
    aVar19 = ber_check_tags(opt_codec_ctx,td,opt_ctx,ptr,size,tag_mode,1,last_length,(int *)0x0);
    uVar16 = aVar19.consumed;
    if (aVar19.code != RC_OK) {
      return aVar19;
    }
    uVar17 = *last_length;
    if (-1 < (long)uVar17) {
      if ((long)(uVar17 + uVar16) < 0) {
        uVar17 = uVar17 + uVar16;
      }
      *last_length = uVar17;
    }
    opt_ctx->phase = opt_ctx->phase + 1;
    ptr = (void *)((long)ptr + uVar16);
    size = size - uVar16;
    opt_ctx->step = 0;
    bVar18 = true;
  }
  else {
    if (sVar2 == 2) {
      uVar17 = opt_ctx->left;
      uVar16 = 0;
      uVar15 = 0;
      if ((long)uVar17 < 0) {
LAB_001458d6:
        uVar15 = uVar16 + uVar17 * -2;
        lVar14 = uVar17 + 1;
        do {
          if (size < 2) {
            if ((size != 0) && (aVar8.consumed = uVar16, aVar8._0_8_ = 2, *ptr != '\0')) {
              return aVar8;
            }
LAB_00145925:
            aVar6.consumed = uVar16;
            aVar6._0_8_ = 1;
            return aVar6;
          }
          if ((*ptr != '\0') || (*(char *)((long)ptr + 1) != '\0')) {
LAB_001458b0:
            aVar7.consumed = uVar16;
            aVar7._0_8_ = 2;
            return aVar7;
          }
          ptr = (void *)((long)ptr + 2);
          uVar16 = uVar16 + 2;
          opt_ctx->left = lVar14;
          lVar14 = lVar14 + 1;
          size = size - 2;
        } while (lVar14 != 1);
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar15;
      opt_ctx->phase = 10;
      return (asn_dec_rval_t)(auVar11 << 0x40);
    }
    if (sVar2 != 1) {
LAB_001456c1:
      aVar19.consumed = 0;
      aVar19._0_8_ = uVar16;
      return aVar19;
    }
    uVar17 = opt_ctx->left;
    bVar18 = (opt_ctx->step & 1) == 0;
    uVar16 = 0;
  }
  ppvVar1 = &opt_ctx->ptr;
  do {
    if (bVar18) {
      if (uVar17 == 0) {
        opt_ctx->phase = 10;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar16;
        return (asn_dec_rval_t)(auVar10 << 0x40);
      }
      if (size < uVar17) {
        uVar17 = size;
      }
      sVar13 = ber_fetch_tag(ptr,uVar17,&tlv_tag);
      if (sVar13 == -1) goto LAB_001458b0;
      if (sVar13 == 0) {
        aVar9._4_4_ = 0;
        aVar9.code = 2 - (size < (ulong)opt_ctx->left || opt_ctx->left < 0);
        aVar9.consumed = uVar16;
        return aVar9;
      }
      uVar17 = opt_ctx->left;
      if (((long)uVar17 < 0) && (*ptr == '\0')) {
        uVar15 = uVar17;
        if (size < uVar17) {
          uVar15 = size;
        }
        if (uVar15 < 2) goto LAB_00145925;
        if (*(char *)((long)ptr + 1) == '\0') {
          opt_ctx->phase = opt_ctx->phase + 1;
          opt_ctx->step = 0;
          goto LAB_001458d6;
        }
      }
      if (tlv_tag != paVar3->tag && paVar3->tag != 0xffffffff) {
        ber_tlv_tag_string(tlv_tag);
        ber_tlv_tag_string(paVar3->tag);
        goto LAB_001458b0;
      }
      *(byte *)&opt_ctx->step = (byte)opt_ctx->step | 1;
    }
    if (size < uVar17) {
      uVar17 = size;
    }
    aVar19.code = (*paVar3->type->ber_decoder)(opt_codec_ctx,paVar3->type,ppvVar1,ptr,uVar17,0);
    if (aVar19.code == (asn_dec_rval_t)0x0) {
      iVar12 = asn_set_add(local_38,*ppvVar1);
      if (iVar12 != 0) goto LAB_00145893;
      *ppvVar1 = (void *)0x0;
    }
    else {
      if (aVar19.code == (asn_dec_rval_t)0x1) {
        uVar17 = opt_ctx->left;
        if (((long)uVar17 < 0) || (size < uVar17)) {
          if (-1 < (long)uVar17) {
            opt_ctx->left = uVar17 - extraout_RDX;
          }
          uVar16 = uVar16 + extraout_RDX;
          goto LAB_00145925;
        }
LAB_00145882:
        (*paVar3->type->free_struct)(paVar3->type,*ppvVar1,0);
        *ppvVar1 = (void *)0x0;
LAB_00145893:
        aVar5.consumed = uVar16;
        aVar5._0_8_ = 2;
        return aVar5;
      }
      if (aVar19.code == (asn_dec_rval_t)0x2) goto LAB_00145882;
    }
    uVar17 = opt_ctx->left;
    if (-1 < (long)uVar17) {
      uVar17 = uVar17 - extraout_RDX;
      opt_ctx->left = uVar17;
    }
    ptr = (void *)((long)ptr + extraout_RDX);
    size = size - extraout_RDX;
    uVar16 = uVar16 + extraout_RDX;
    opt_ctx->step = 0;
    bVar18 = true;
  } while( true );
}

Assistant:

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const void *ptr, size_t size, int tag_mode) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	ber_tlv_tag_t tlv_tag;	/* T from TLV */
	asn_dec_rval_t rval;	/* Return code from subparsers */

	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	ASN_DEBUG("Decoding %s as SET OF", td->name);
	
	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) {
			RETURN(RC_FAIL);
		}
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	
	/*
	 * Start to parse where left previously
	 */
	switch(ctx->phase) {
	case 0:
		/*
		 * PHASE 0.
		 * Check that the set of tags associated with given structure
		 * perfectly fits our expectations.
		 */

		rval = ber_check_tags(opt_codec_ctx, td, ctx, ptr, size,
			tag_mode, 1, &ctx->left, 0);
		if(rval.code != RC_OK) {
			ASN_DEBUG("%s tagging check failed: %d",
				td->name, rval.code);
			return rval;
		}

		if(ctx->left >= 0)
			ctx->left += rval.consumed; /* ?Substracted below! */
		ADVANCE(rval.consumed);

		ASN_DEBUG("Structure consumes %ld bytes, "
			"buffer %ld", (long)ctx->left, (long)size);

		NEXT_PHASE(ctx);
		/* Fall through */
	case 1:
		/*
		 * PHASE 1.
		 * From the place where we've left it previously,
		 * try to decode the next item.
		 */
	  for(;; ctx->step = 0) {
		ssize_t tag_len;	/* Length of TLV's T */

		if(ctx->step & 1)
			goto microphase2;

		/*
		 * MICROPHASE 1: Synchronize decoding.
		 */

		if(ctx->left == 0) {
			ASN_DEBUG("End of SET OF %s", td->name);
			/*
			 * No more things to decode.
			 * Exit out of here.
			 */
			PHASE_OUT(ctx);
			RETURN(RC_OK);
		}

		/*
		 * Fetch the T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, LEFT, &tlv_tag);
		switch(tag_len) {
		case 0: if(!SIZE_VIOLATION) RETURN(RC_WMORE);
			/* Fall through */
		case -1: RETURN(RC_FAIL);
		}

		if(ctx->left < 0 && ((const uint8_t *)ptr)[0] == 0) {
			if(LEFT < 2) {
				if(SIZE_VIOLATION)
					RETURN(RC_FAIL);
				else
					RETURN(RC_WMORE);
			} else if(((const uint8_t *)ptr)[1] == 0) {
				/*
				 * Found the terminator of the
				 * indefinite length structure.
				 */
				break;
			}
		}

		/* Outmost tag may be unknown and cannot be fetched/compared */
		if(elm->tag != (ber_tlv_tag_t)-1) {
		    if(BER_TAGS_EQUAL(tlv_tag, elm->tag)) {
			/*
			 * The new list member of expected type has arrived.
			 */
		    } else {
			ASN_DEBUG("Unexpected tag %s fixed SET OF %s",
				ber_tlv_tag_string(tlv_tag), td->name);
			ASN_DEBUG("%s SET OF has tag %s",
				td->name, ber_tlv_tag_string(elm->tag));
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * MICROPHASE 2: Invoke the member-specific decoder.
		 */
		ctx->step |= 1;		/* Confirm entering next microphase */
	microphase2:
		
		/*
		 * Invoke the member fetch routine according to member's type
		 */
		rval = elm->type->ber_decoder(opt_codec_ctx,
				elm->type, &ctx->ptr, ptr, LEFT, 0);
		ASN_DEBUG("In %s SET OF %s code %d consumed %d",
			td->name, elm->type->name,
			rval.code, (int)rval.consumed);
		switch(rval.code) {
		case RC_OK:
			{
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				else
					ctx->ptr = 0;
			}
			break;
		case RC_WMORE: /* More data expected */
			if(!SIZE_VIOLATION) {
				ADVANCE(rval.consumed);
				RETURN(RC_WMORE);
			}
			/* Fall through */
		case RC_FAIL: /* Fatal error */
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
			RETURN(RC_FAIL);
		} /* switch(rval) */
		
		ADVANCE(rval.consumed);
	  }	/* for(all list members) */

		NEXT_PHASE(ctx);
	case 2:
		/*
		 * Read in all "end of content" TLVs.
		 */
		while(ctx->left < 0) {
			if(LEFT < 2) {
				if(LEFT > 0 && ((const char *)ptr)[0] != 0) {
					/* Unexpected tag */
					RETURN(RC_FAIL);
				} else {
					RETURN(RC_WMORE);
				}
			}
			if(((const char *)ptr)[0] == 0
			&& ((const char *)ptr)[1] == 0) {
				ADVANCE(2);
				ctx->left++;
			} else {
				RETURN(RC_FAIL);
			}
		}

		PHASE_OUT(ctx);
	}
	
	RETURN(RC_OK);
}